

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::
GenerateDynamicMethodNewBuildMessageInfo(ImmutableMessageLiteGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  FieldDescriptor *this_01;
  Printer *this_02;
  bool bVar3;
  Edition EVar4;
  int iVar5;
  JavaType JVar6;
  reference ppVar7;
  OneofGeneratorInfo *args_1;
  ImmutableFieldLiteGenerator *pIVar8;
  FieldDescriptor **ppFVar9;
  Descriptor *pDVar10;
  Nonnull<const_char_*> pcVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar12;
  uint uVar13;
  uint uVar14;
  java *this_03;
  uint32_t uVar15;
  long lVar16;
  uint uVar17;
  uint32_t number;
  long lVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  string_view text;
  const_iterator other;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  iterator iVar22;
  string line;
  vector<unsigned_short,_std::allocator<unsigned_short>_> chars;
  string local_98;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  Printer *local_58;
  uint local_4c;
  LogMessageFatal local_48;
  FieldDescriptor *local_38;
  
  printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar10 = (this->super_MessageGenerator).descriptor_;
  uVar17 = (uint)(pDVar10->options_->field_0)._impl_.message_set_wire_format_ * 2;
  uVar13 = uVar17;
  if ((this->context_->options_).strip_nonfunctional_codegen == false) {
    EVar4 = FileDescriptor::edition(pDVar10->file_);
    if (EVar4 == EDITION_PROTO2) {
      uVar13 = uVar17 | 1;
    }
    else {
      EVar4 = FileDescriptor::edition(((this->super_MessageGenerator).descriptor_)->file_);
      uVar13 = uVar17 + 4;
      if ((int)EVar4 < 1000) {
        uVar13 = uVar17;
      }
    }
  }
  WriteUInt32ToUtf16CharSequence(uVar13,&local_78);
  WriteUInt32ToUtf16CharSequence
            (((this->super_MessageGenerator).descriptor_)->field_count_,&local_78);
  local_58 = printer;
  if (((this->super_MessageGenerator).descriptor_)->field_count_ == 0) {
    text_02._M_str = "java.lang.Object[] objects = null;\n";
    text_02._M_len = 0x23;
    io::Printer::Print<>(printer,text_02);
  }
  else {
    text._M_str = "java.lang.Object[] objects = new java.lang.Object[] {\n";
    text._M_len = 0x36;
    io::Printer::Print<>(printer,text);
    printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
    WriteUInt32ToUtf16CharSequence
              ((uint32_t)
               (this->super_MessageGenerator).oneofs_.
               super_btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
               .
               super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
               .
               super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
               .tree_.size_,&local_78);
    this_00 = &(this->super_MessageGenerator).oneofs_;
    iVar22 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      *)this_00);
    local_98._M_dataplus._M_p = (pointer)iVar22.node_;
    local_98._M_string_length = CONCAT44(local_98._M_string_length._4_4_,iVar22.position_);
    iVar22 = absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
             ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                    *)this_00);
    while (other._12_4_ = 0,
          other.node_ = (btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                         *)SUB128(iVar22._0_12_,0), other.position_ = SUB124(iVar22._0_12_,8),
          bVar3 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  ::Equals((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                            *)&local_98,other), !bVar3) {
      ppVar7 = absl::lts_20250127::container_internal::
               btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
               ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                            *)&local_98);
      args_1 = Context::GetOneofGeneratorInfo(this->context_,ppVar7->second);
      text_00._M_str = "\"$oneof_name$_\",\n\"$oneof_name$Case_\",\n";
      text_00._M_len = 0x26;
      io::Printer::Print<char[11],std::__cxx11::string>
                (local_58,text_00,(char (*) [11])0x12e0c8e,&args_1->name);
      absl::lts_20250127::container_internal::
      btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
      ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   *)&local_98);
    }
    pDVar10 = (this->super_MessageGenerator).descriptor_;
    if (pDVar10->field_count_ < 1) {
      uVar17 = 0;
    }
    else {
      lVar18 = 0;
      lVar19 = 0;
      iVar21 = 0;
      do {
        pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                 get(&this->field_generators_,
                     (FieldDescriptor *)(&pDVar10->fields_->super_SymbolBase + lVar18));
        iVar5 = (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[3])(pIVar8);
        iVar21 = iVar21 + iVar5;
        lVar19 = lVar19 + 1;
        pDVar10 = (this->super_MessageGenerator).descriptor_;
        lVar18 = lVar18 + 0x58;
      } while (lVar19 < pDVar10->field_count_);
      iVar5 = iVar21 + 0x3e;
      if (-1 < iVar21 + 0x1f) {
        iVar5 = iVar21 + 0x1f;
      }
      uVar17 = iVar5 >> 5;
      if (0 < iVar21) {
        uVar13 = 1;
        if (1 < (int)uVar17) {
          uVar13 = uVar17;
        }
        this_03 = (java *)0x0;
        uVar12 = extraout_RDX;
        local_4c = uVar17;
        do {
          GetBitFieldName_abi_cxx11_(&local_98,this_03,(int)uVar12);
          text_01._M_str = "\"$bit_field_name$\",\n";
          text_01._M_len = 0x14;
          io::Printer::Print<char[15],std::__cxx11::string>
                    (local_58,text_01,(char (*) [15])"bit_field_name",&local_98);
          uVar12 = extraout_RDX_00;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            uVar12 = extraout_RDX_01;
          }
          uVar14 = (int)this_03 + 1;
          this_03 = (java *)(ulong)uVar14;
          uVar17 = local_4c;
        } while (uVar13 != uVar14);
      }
    }
    WriteUInt32ToUtf16CharSequence(uVar17,&local_78);
    ppFVar9 = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
    if (((this->super_MessageGenerator).descriptor_)->field_count_ < 1) {
      number = 0;
      uVar15 = 0;
    }
    else {
      lVar18 = 0;
      uVar15 = 0;
      number = 0;
      do {
        this_01 = ppFVar9[lVar18];
        if ((this_01->type_ == '\v') &&
           (bVar3 = FieldDescriptor::is_map_message_type(this_01), bVar3)) {
          number = number + 1;
        }
        else {
          bVar2 = this_01->field_0x1;
          uVar17 = (bVar2 & 0x20) >> 5;
          if (0xbf < bVar2 != SUB41(uVar17,0)) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                ((char)(bVar2 & 0x20) != '\0',0xbf < bVar2,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_98,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar11);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_98);
          }
          uVar15 = uVar15 + uVar17;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < ((this->super_MessageGenerator).descriptor_)->field_count_);
    }
    WriteUInt32ToUtf16CharSequence((*ppFVar9)->number_,&local_78);
    WriteUInt32ToUtf16CharSequence
              (ppFVar9[(long)((this->super_MessageGenerator).descriptor_)->field_count_ + -1]->
               number_,&local_78);
    WriteUInt32ToUtf16CharSequence
              (((this->super_MessageGenerator).descriptor_)->field_count_,&local_78);
    WriteUInt32ToUtf16CharSequence(number,&local_78);
    WriteUInt32ToUtf16CharSequence(uVar15,&local_78);
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    pDVar10 = (this->super_MessageGenerator).descriptor_;
    if (pDVar10->field_count_ < 1) {
      uVar15 = 0;
    }
    else {
      lVar18 = 0;
      lVar19 = 0;
      do {
        bVar3 = FieldDescriptor::is_required
                          ((FieldDescriptor *)(&pDVar10->fields_->super_SymbolBase + lVar18));
        if (bVar3) {
LAB_00e731f6:
          pDVar10 = (this->super_MessageGenerator).descriptor_;
          lVar16 = (long)pDVar10->field_count_;
          if (lVar16 <= lVar19) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar19,lVar16,"index < field_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar11);
LAB_00e734f3:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_48);
          }
          local_38 = (FieldDescriptor *)(&pDVar10->fields_->super_SymbolBase + lVar18);
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::emplace_back<google::protobuf::FieldDescriptor_const*>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&local_98,&local_38);
        }
        else {
          pDVar10 = (this->super_MessageGenerator).descriptor_;
          lVar16 = (long)pDVar10->field_count_;
          if (lVar16 <= lVar19) {
            pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar19,lVar16,"index < field_count()");
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      (&local_48,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar11);
            goto LAB_00e734f3;
          }
          JVar6 = GetJavaType((FieldDescriptor *)(&pDVar10->fields_->super_SymbolBase + lVar18));
          if (JVar6 == JAVATYPE_MESSAGE) {
            pDVar10 = (this->super_MessageGenerator).descriptor_;
            lVar16 = (long)pDVar10->field_count_;
            if (lVar16 <= lVar19) {
              pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                  (lVar19,lVar16,"index < field_count()");
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        (&local_48,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xa88,pcVar11);
              goto LAB_00e734f3;
            }
            pDVar10 = FieldDescriptor::message_type
                                ((FieldDescriptor *)(&pDVar10->fields_->super_SymbolBase + lVar18));
            bVar3 = HasRequiredFields(pDVar10);
            if (bVar3) goto LAB_00e731f6;
          }
        }
        lVar19 = lVar19 + 1;
        pDVar10 = (this->super_MessageGenerator).descriptor_;
        lVar18 = lVar18 + 0x58;
      } while (lVar19 < pDVar10->field_count_);
      uVar15 = (uint32_t)(local_98._M_string_length - (long)local_98._M_dataplus._M_p >> 3);
    }
    WriteUInt32ToUtf16CharSequence(uVar15,&local_78);
    if (0 < ((this->super_MessageGenerator).descriptor_)->field_count_) {
      lVar18 = 0;
      do {
        pIVar8 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>::
                 get(&this->field_generators_,ppFVar9[lVar18]);
        (*(pIVar8->super_FieldGenerator)._vptr_FieldGenerator[8])(pIVar8,local_58,&local_78);
        lVar18 = lVar18 + 1;
      } while (lVar18 < ((this->super_MessageGenerator).descriptor_)->field_count_);
    }
    printer = local_58;
    io::Printer::Outdent(local_58);
    text_03._M_str = "};\n";
    text_03._M_len = 3;
    io::Printer::Print<>(printer,text_03);
    if (local_98._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_98._M_dataplus._M_p,
                      local_98.field_2._M_allocated_capacity - (long)local_98._M_dataplus._M_p);
    }
    operator_delete__(ppFVar9);
  }
  text_04._M_str = "java.lang.String info =\n";
  text_04._M_len = 0x18;
  io::Printer::Print<>(printer,text_04);
  paVar1 = &local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  if (local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar20 = 0;
    do {
      EscapeUtf16ToString(local_78.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar20],&local_98);
      if (0x4f < local_98._M_string_length) {
        text_05._M_str = "    \"$string$\" +\n";
        text_05._M_len = 0x11;
        io::Printer::Print<char[7],std::__cxx11::string>
                  (local_58,text_05,(char (*) [7])0x12172e7,&local_98);
        local_98._M_string_length = 0;
        *local_98._M_dataplus._M_p = '\0';
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 < (ulong)((long)local_78.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_78.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1));
  }
  this_02 = local_58;
  text_06._M_str = "    \"$string$\";\n";
  text_06._M_len = 0x10;
  io::Printer::Print<char[7],std::__cxx11::string>
            (local_58,text_06,(char (*) [7])0x12172e7,&local_98);
  text_07._M_str = "return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n";
  text_07._M_len = 0x38;
  io::Printer::Print<>(this_02,text_07);
  io::Printer::Outdent(this_02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateDynamicMethodNewBuildMessageInfo(
    io::Printer* printer) {
  printer->Indent();

  // Collect field info into a sequence of UTF-16 chars. It will be embedded
  // as a Java string in the generated code.
  std::vector<uint16_t> chars;

  int flags = 0;
  if (descriptor_->options().message_set_wire_format()) {
    flags |= 0x2;
  }
  if (!context_->options().strip_nonfunctional_codegen) {
    if (JavaGenerator::GetEdition(*descriptor_->file()) ==
        Edition::EDITION_PROTO2) {
      flags |= 0x1;
    } else if (JavaGenerator::GetEdition(*descriptor_->file()) >=
               Edition::EDITION_2023) {
      flags |= 0x4;
    }
  }

  WriteIntToUtf16CharSequence(flags, &chars);
  WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);

  if (descriptor_->field_count() == 0) {
    printer->Print("java.lang.Object[] objects = null;\n");
  } else {
    // A single array of all fields (including oneof, oneofCase, hasBits).
    printer->Print("java.lang.Object[] objects = new java.lang.Object[] {\n");
    printer->Indent();

    // Record the number of oneofs.
    WriteIntToUtf16CharSequence(oneofs_.size(), &chars);
    for (auto& kv : oneofs_) {
      printer->Print(
          "\"$oneof_name$_\",\n"
          "\"$oneof_name$Case_\",\n",
          "oneof_name", context_->GetOneofGeneratorInfo(kv.second)->name);
    }

    // Integers for bit fields.
    int total_bits = 0;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      total_bits +=
          field_generators_.get(descriptor_->field(i)).GetNumBitsForMessage();
    }
    int total_ints = (total_bits + 31) / 32;
    for (int i = 0; i < total_ints; i++) {
      printer->Print("\"$bit_field_name$\",\n", "bit_field_name",
                     GetBitFieldName(i));
    }
    WriteIntToUtf16CharSequence(total_ints, &chars);

    int map_count = 0;
    int repeated_count = 0;
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));
    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      if (field->is_map()) {
        map_count++;
      } else if (field->is_repeated()) {
        repeated_count++;
      }
    }

    WriteIntToUtf16CharSequence(sorted_fields[0]->number(), &chars);
    WriteIntToUtf16CharSequence(
        sorted_fields[descriptor_->field_count() - 1]->number(), &chars);
    WriteIntToUtf16CharSequence(descriptor_->field_count(), &chars);
    WriteIntToUtf16CharSequence(map_count, &chars);
    WriteIntToUtf16CharSequence(repeated_count, &chars);

    std::vector<const FieldDescriptor*> fields_for_is_initialized_check;
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (descriptor_->field(i)->is_required() ||
          (GetJavaType(descriptor_->field(i)) == JAVATYPE_MESSAGE &&
           HasRequiredFields(descriptor_->field(i)->message_type()))) {
        fields_for_is_initialized_check.push_back(descriptor_->field(i));
      }
    }
    WriteIntToUtf16CharSequence(fields_for_is_initialized_check.size(), &chars);

    for (int i = 0; i < descriptor_->field_count(); i++) {
      const FieldDescriptor* field = sorted_fields[i];
      field_generators_.get(field).GenerateFieldInfo(printer, &chars);
    }
    printer->Outdent();
    printer->Print("};\n");
  }

  printer->Print("java.lang.String info =\n");
  std::string line;
  for (size_t i = 0; i < chars.size(); i++) {
    uint16_t code = chars[i];
    EscapeUtf16ToString(code, &line);
    if (line.size() >= 80) {
      printer->Print("    \"$string$\" +\n", "string", line);
      line.clear();
    }
  }
  printer->Print("    \"$string$\";\n", "string", line);

  printer->Print("return newMessageInfo(DEFAULT_INSTANCE, info, objects);\n");
  printer->Outdent();
}